

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

SceneSignal __thiscall GroundScene::update(GroundScene *this)

{
  value_type pOVar1;
  SceneSignal SVar2;
  bool bVar3;
  uint uVar4;
  reference ppOVar5;
  size_type sVar6;
  reference ppOVar7;
  ulong uVar8;
  int extraout_var;
  ostream *this_00;
  int iVar9;
  string local_230;
  stringstream local_200 [8];
  stringstream debugString;
  ostream local_1f0 [380];
  undefined1 local_74 [8];
  ObjectSignal os;
  int i_2;
  int type1;
  int j_1;
  int type0;
  int i_1;
  const_iterator local_48;
  Object **local_40;
  __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_> local_38;
  int local_30;
  int local_2c;
  int j;
  int i;
  __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_> local_20;
  iterator ite;
  GroundScene *this_local;
  SceneSignal signal;
  
  ite._M_current = (Object **)this;
  SceneSignal::SceneSignal((SceneSignal *)&this_local,10,0);
  if (this->score != 0) {
    this_local._0_4_ = 0xd;
    this_local._4_4_ = this->score;
    this->score = 0;
  }
  _j = std::vector<Object_*,_std::allocator<Object_*>_>::begin(&this->objects);
  local_20 = __gnu_cxx::
             __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
             operator+((__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                        *)&j,(long)this->sunVectorN);
  for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 10; local_30 = local_30 + 1) {
      if ((this->plants[local_2c][local_30] != (Plant *)0x0) &&
         (uVar4 = (*(this->plants[local_2c][local_30]->super_Charactor).super_Object._vptr_Object[3]
                  )(), (uVar4 & 1) != 0)) {
        this->plants[local_2c][local_30] = (Plant *)0x0;
      }
    }
  }
  while( true ) {
    local_38._M_current =
         (Object **)std::vector<Object_*,_std::allocator<Object_*>_>::end(&this->objects);
    bVar3 = __gnu_cxx::operator!=(&local_20,&local_38);
    if (!bVar3) break;
    ppOVar5 = __gnu_cxx::
              __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
              operator*(&local_20);
    uVar4 = (*(*ppOVar5)->_vptr_Object[3])();
    if ((uVar4 & 1) == 0) {
      __gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
      operator++(&local_20,0);
    }
    else {
      __gnu_cxx::__normal_iterator<Object*const*,std::vector<Object*,std::allocator<Object*>>>::
      __normal_iterator<Object**>
                ((__normal_iterator<Object*const*,std::vector<Object*,std::allocator<Object*>>> *)
                 &local_48,&local_20);
      local_40 = (Object **)
                 std::vector<Object_*,_std::allocator<Object_*>_>::erase(&this->objects,local_48);
      local_20._M_current = local_40;
    }
  }
  if (this->count == 0x50) {
    genSunRandom(this);
    this->count = 0;
  }
  else {
    this->count = this->count + 1;
  }
  for (j_1 = this->sunVectorN;
      sVar6 = std::vector<Object_*,_std::allocator<Object_*>_>::size(&this->objects),
      (ulong)(long)j_1 < sVar6; j_1 = j_1 + 1) {
    ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[](&this->objects,(long)j_1)
    ;
    iVar9 = (*ppOVar7)->type % 10;
    i_2 = j_1;
    while( true ) {
      i_2 = i_2 + 1;
      sVar6 = std::vector<Object_*,_std::allocator<Object_*>_>::size(&this->objects);
      if (sVar6 <= (ulong)(long)i_2) break;
      ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                          (&this->objects,(long)i_2);
      os.y = (*ppOVar7)->type % 10;
      if (iVar9 != os.y) {
        if ((iVar9 == 5) && (os.y == 4)) {
          ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                              (&this->objects,(long)j_1);
          pOVar1 = *ppOVar7;
          ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                              (&this->objects,(long)i_2);
          (*pOVar1->_vptr_Object[7])(pOVar1,*ppOVar7);
        }
        else if ((iVar9 == 3) && (os.y == 4)) {
          ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                              (&this->objects,(long)j_1);
          pOVar1 = *ppOVar7;
          ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                              (&this->objects,(long)i_2);
          (*pOVar1->_vptr_Object[0x11])(pOVar1,*ppOVar7);
          ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                              (&this->objects,(long)i_2);
          pOVar1 = *ppOVar7;
          ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                              (&this->objects,(long)j_1);
          (*pOVar1->_vptr_Object[0xe])(pOVar1,*ppOVar7);
        }
        else if (iVar9 == 4) {
          if (os.y == 3) {
            ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                                (&this->objects,(long)i_2);
            pOVar1 = *ppOVar7;
            ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                                (&this->objects,(long)j_1);
            (*pOVar1->_vptr_Object[0x11])(pOVar1,*ppOVar7);
            ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                                (&this->objects,(long)j_1);
            pOVar1 = *ppOVar7;
            ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                                (&this->objects,(long)i_2);
            (*pOVar1->_vptr_Object[0xe])(pOVar1,*ppOVar7);
          }
          else if (os.y == 5) {
            ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                                (&this->objects,(long)i_2);
            pOVar1 = *ppOVar7;
            ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                                (&this->objects,(long)j_1);
            (*pOVar1->_vptr_Object[7])(pOVar1,*ppOVar7);
          }
        }
      }
    }
  }
  os.x = 0;
  do {
    uVar8 = (ulong)os.x;
    sVar6 = std::vector<Object_*,_std::allocator<Object_*>_>::size(&this->objects);
    if (sVar6 <= uVar8) {
      randomGenZombie(this);
      std::__cxx11::stringstream::stringstream(local_200);
      this_00 = std::operator<<(local_1f0,"n: ");
      sVar6 = std::vector<Object_*,_std::allocator<Object_*>_>::size(&this->objects);
      std::ostream::operator<<(this_00,sVar6);
      std::__cxx11::stringstream::str();
      drawText(0,0x2f,&local_230,0,0xf);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::stringstream::~stringstream(local_200);
LAB_00113274:
      SVar2.data = this_local._4_4_;
      SVar2.type = (int)this_local;
      return SVar2;
    }
    ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                        (&this->objects,(long)os.x);
    (**(*ppOVar7)->_vptr_Object)();
    ppOVar7 = std::vector<Object_*,_std::allocator<Object_*>_>::operator[]
                        (&this->objects,(long)os.x);
    local_74._0_4_ = (*(*ppOVar7)->_vptr_Object[2])();
    local_74._4_4_ = extraout_var;
    processObjSignal(this,(ObjectSignal *)local_74);
    if (this->state == 5) {
      this_local._0_4_ = 0xe;
      goto LAB_00113274;
    }
    os.x = os.x + 1;
  } while( true );
}

Assistant:

SceneSignal GroundScene::update(){
	SceneSignal signal(GS_SIGNAL_NULL, 0);
	if(score != 0){
		signal.type = GS_SIGNAL_ADD_SCORE;
		signal.data = score;
		score = 0;
	}
	std::vector<Object*>::iterator ite = objects.begin()+sunVectorN;
	for(int i = 0; i < GSBH; ++i){
		for(int j = 0; j < GSBW; ++j){
			if(plants[i][j] != NULL && plants[i][j]->getIsDead()){
				plants[i][j] = NULL;
			}
		}
	}
	while(ite != objects.end()){
		if((*ite)->getIsDead()){
			ite = objects.erase(ite);
		}
		else{
			ite++;
		}
	}
	if(count == SUNFLOWER_GEN_SUN_SPEED){
		genSunRandom();
		count = 0;
	}
	else{
		count++;
	}
	for(int i = sunVectorN; i < objects.size(); ++i){
		int type0 = objects[i]->type%10;
		for(int j = i+1; j < objects.size(); ++j){
			int type1 = objects[j]->type%10;
			if(type0 == type1){
				continue;
			}
			else{
				if(type0 == OBJ_TYPE_BULLET && type1 == OBJ_TYPE_ZOMBIE){
					/* drawText(0, SH+2, "here1", BLACK, WHITE); */
					((Bullet*)objects[i])->interactive((Zombie*)objects[j]);
				}
				else if(type0 == OBJ_TYPE_PLANT && type1 == OBJ_TYPE_ZOMBIE){
					((Plant*)objects[i])->interactive((Zombie*)objects[j]);
					((Zombie*)objects[j])->interactive((Plant*)objects[i]);
				}
				else if(type0 == OBJ_TYPE_ZOMBIE){
					if(type1 == OBJ_TYPE_PLANT){
						((Plant*)objects[j])->interactive((Zombie*)objects[i]);
						((Zombie*)objects[i])->interactive((Plant*)objects[j]);
					}
					else if(type1 == OBJ_TYPE_BULLET){
						/* drawText(0, SH+2, "here2", BLACK, WHITE); */
						((Bullet*)objects[j])->interactive((Zombie*)objects[i]);
					}
				}
			}
		}
	}
	for(int i = 0; i < objects.size(); ++i){
		objects[i]->update();
		ObjectSignal os = objects[i]->getSignal();
		processObjSignal(os);
		if(state == STATE_OVER){
			signal.type = GS_SIGNAL_OVER; 
			return signal;
		}
	}
	randomGenZombie();


	std::stringstream debugString;
	debugString << "n: " << objects.size();
	drawText(0, SH+1, debugString.str(), BLACK, WHITE);
	return signal;
}